

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

int4 __thiscall DecisionNode::getNumFixed(DecisionNode *this,int4 low,int4 size,bool context)

{
  uintm uVar1;
  pointer ppVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int4 iVar6;
  
  ppVar2 = (this->list).
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppVar2) {
    iVar6 = 0;
  }
  else {
    uVar5 = -1 << ((byte)size & 0x1f);
    lVar4 = 0;
    if (size == 0x20) {
      uVar5 = 0;
    }
    uVar3 = 0;
    iVar6 = 0;
    do {
      uVar1 = DisjointPattern::getMask
                        (*(DisjointPattern **)((long)&ppVar2->first + lVar4),low,size,context);
      iVar6 = iVar6 + (uint)((uVar1 | uVar5) == 0xffffffff);
      uVar3 = uVar3 + 1;
      ppVar2 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)(this->list).
                                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4));
  }
  return iVar6;
}

Assistant:

int4 DecisionNode::getNumFixed(int4 low,int4 size,bool context)

{				// Get number of patterns that specify this field
  int4 count = 0;
  uintm mask;
				// Bits which must be specified in the mask
  uintm m = (size==8*sizeof(uintm)) ? 0 : (((uintm)1)<<size);
  m = m-1;

  for(int4 i=0;i<list.size();++i) {
    mask = list[i].first->getMask(low,size,context);
    if ((mask&m)==m)
      count += 1;
  }
  return count;
}